

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O2

void __thiscall llvm::raw_ostream::copy_to_buffer(raw_ostream *this,char *Ptr,size_t Size)

{
  char *__dest;
  
  __dest = this->OutBufCur;
  if ((ulong)((long)this->OutBufEnd - (long)__dest) < Size) {
    __assert_fail("Size <= size_t(OutBufEnd - OutBufCur) && \"Buffer overrun!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/raw_ostream.cpp"
                  ,0x121,"void llvm::raw_ostream::copy_to_buffer(const char *, size_t)");
  }
  switch(Size) {
  case 0:
    break;
  case 4:
    __dest[3] = Ptr[3];
    __dest = this->OutBufCur;
  case 3:
    __dest[2] = Ptr[2];
    __dest = this->OutBufCur;
  case 2:
    __dest[1] = Ptr[1];
    __dest = this->OutBufCur;
  case 1:
    *__dest = *Ptr;
    break;
  default:
    memcpy(__dest,Ptr,Size);
  }
  this->OutBufCur = this->OutBufCur + Size;
  return;
}

Assistant:

void raw_ostream::copy_to_buffer(const char *Ptr, size_t Size) {
  assert(Size <= size_t(OutBufEnd - OutBufCur) && "Buffer overrun!");

  // Handle short strings specially, memcpy isn't very good at very short
  // strings.
  switch (Size) {
  case 4: OutBufCur[3] = Ptr[3]; LLVM_FALLTHROUGH;
  case 3: OutBufCur[2] = Ptr[2]; LLVM_FALLTHROUGH;
  case 2: OutBufCur[1] = Ptr[1]; LLVM_FALLTHROUGH;
  case 1: OutBufCur[0] = Ptr[0]; LLVM_FALLTHROUGH;
  case 0: break;
  default:
    memcpy(OutBufCur, Ptr, Size);
    break;
  }

  OutBufCur += Size;
}